

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Fts5BufferAppendPrintf(int *pRc,Fts5Buffer *pBuf,char *zFmt,...)

{
  char in_AL;
  u8 *pData;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (*pRc == 0) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    pData = (u8 *)sqlite3_vmprintf(zFmt,&local_e8);
    if (pData == (u8 *)0x0) {
      *pRc = 7;
    }
    else {
      sVar1 = strlen((char *)pData);
      sqlite3Fts5BufferAppendBlob(pRc,pBuf,(int)sVar1 + 1,pData);
      pBuf->n = pBuf->n + -1;
      sqlite3_free(pData);
    }
  }
  return;
}

Assistant:

static void sqlite3Fts5BufferAppendPrintf(
  int *pRc,
  Fts5Buffer *pBuf, 
  char *zFmt, ...
){
  if( *pRc==SQLITE_OK ){
    char *zTmp;
    va_list ap;
    va_start(ap, zFmt);
    zTmp = sqlite3_vmprintf(zFmt, ap);
    va_end(ap);

    if( zTmp==0 ){
      *pRc = SQLITE_NOMEM;
    }else{
      sqlite3Fts5BufferAppendString(pRc, pBuf, zTmp);
      sqlite3_free(zTmp);
    }
  }
}